

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O1

bool CLParser::IsSystemInclude(string *path)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  size_type sVar5;
  char cVar6;
  bool bVar7;
  
  sVar2 = path->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (path->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      cVar1 = pcVar3[sVar5];
      cVar6 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar6 = cVar1;
      }
      pcVar3[sVar5] = cVar6;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  lVar4 = std::__cxx11::string::find((char *)path,0x125b34,0);
  bVar7 = true;
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)path,0x125b42,0);
    bVar7 = lVar4 != -1;
  }
  return bVar7;
}

Assistant:

bool CLParser::IsSystemInclude(string path) {
  transform(path.begin(), path.end(), path.begin(), ToLowerASCII);
  // TODO: this is a heuristic, perhaps there's a better way?
  return (path.find("program files") != string::npos ||
          path.find("microsoft visual studio") != string::npos);
}